

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 uVar3;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  StringPiece s1_03;
  StringPiece s1_04;
  StringPiece s1_05;
  StringPiece s1_06;
  StringPiece s1_07;
  StringPiece s1_08;
  StringPiece s2;
  StringPiece s2_00;
  StringPiece s2_01;
  StringPiece s2_02;
  StringPiece s2_03;
  StringPiece s2_04;
  StringPiece s2_05;
  StringPiece s2_06;
  StringPiece s2_07;
  StringPiece s2_08;
  LogFinisher local_61;
  LogMessage local_60;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x519);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"CHECK failed: value != nullptr: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  s1.ptr_ = (char *)this;
  s2.length_ = 4;
  s2.ptr_ = "true";
  bVar1 = CaseEqual(s1,s2);
  uVar3 = 1;
  if ((((!bVar1) &&
       (s1_00.length_ = (stringpiece_ssize_type)s1.length_, s1_00.ptr_ = (char *)this,
       s2_00.length_ = 1, s2_00.ptr_ = "t", bVar1 = CaseEqual(s1_00,s2_00), !bVar1)) &&
      (s1_01.length_ = (stringpiece_ssize_type)s1.length_, s1_01.ptr_ = (char *)this,
      s2_01.length_ = 3, s2_01.ptr_ = "yes", bVar1 = CaseEqual(s1_01,s2_01), !bVar1)) &&
     ((s1_02.length_ = (stringpiece_ssize_type)s1.length_, s1_02.ptr_ = (char *)this,
      s2_02.length_ = 1, s2_02.ptr_ = "y", bVar1 = CaseEqual(s1_02,s2_02), !bVar1 &&
      (s1_03.length_ = (stringpiece_ssize_type)s1.length_, s1_03.ptr_ = (char *)this,
      s2_03.length_ = 1, s2_03.ptr_ = "1", bVar1 = CaseEqual(s1_03,s2_03), !bVar1)))) {
    s1_04.length_ = (stringpiece_ssize_type)s1.length_;
    s1_04.ptr_ = (char *)this;
    s2_04.length_ = 5;
    s2_04.ptr_ = "false";
    bVar1 = CaseEqual(s1_04,s2_04);
    if (((bVar1) ||
        ((s1_05.length_ = (stringpiece_ssize_type)s1.length_, s1_05.ptr_ = (char *)this,
         s2_05.length_ = 1, s2_05.ptr_ = "f", bVar1 = CaseEqual(s1_05,s2_05), bVar1 ||
         (s1_06.length_ = (stringpiece_ssize_type)s1.length_, s1_06.ptr_ = (char *)this,
         s2_06.length_ = 2, s2_06.ptr_ = "no", bVar1 = CaseEqual(s1_06,s2_06), bVar1)))) ||
       (s1_07.length_ = (stringpiece_ssize_type)s1.length_, s1_07.ptr_ = (char *)this,
       s2_07.length_ = 1, s2_07.ptr_ = "n", bVar1 = CaseEqual(s1_07,s2_07), bVar1)) {
      uVar3 = 0;
    }
    else {
      s1_08.length_ = (stringpiece_ssize_type)s1.length_;
      s1_08.ptr_ = (char *)this;
      s2_08.length_ = 1;
      s2_08.ptr_ = "0";
      bVar1 = CaseEqual(s1_08,s2_08);
      uVar3 = 0;
      if (!bVar1) {
        return false;
      }
    }
  }
  *(undefined1 *)str.length_ = uVar3;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}